

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

bool __thiscall libtorrent::aux::listen_socket_t::can_route(listen_socket_t *this,address *addr)

{
  sa_family_t sVar1;
  anon_enum_32 aVar2;
  bool bVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  bad_address_cast ex;
  undefined8 local_30;
  anon_union_16_3_a3f0114d_for___in6_u local_28;
  ulong local_18;
  
  bVar4 = true;
  if (((this->flags).m_val & 8) != 0) {
    return true;
  }
  sVar1 = (this->local_endpoint).impl_.data_.base.sa_family;
  aVar2 = addr->type_;
  if ((aVar2 == ipv4) == (sVar1 == 2)) {
    if (sVar1 == 2) {
LAB_002c19a7:
      local_30._4_4_ = (in4_addr_type)(this->local_endpoint).impl_.data_.v6.sin6_flowinfo;
      local_30._0_4_ = ipv4;
      local_28 = (anon_union_16_3_a3f0114d_for___in6_u)0x0;
      local_18 = 0;
    }
    else {
      if (aVar2 != ipv6) {
        local_30 = &PTR__bad_cast_004ee530;
        boost::throw_exception<boost::asio::ip::bad_address_cast>((bad_address_cast *)&local_30);
      }
      if ((addr->ipv6_address_).scope_id_ !=
          (ulong)(this->local_endpoint).impl_.data_.v6.sin6_scope_id) goto LAB_002c1995;
      if (sVar1 == 2) goto LAB_002c19a7;
      local_28 = *(anon_union_16_3_a3f0114d_for___in6_u *)
                  ((anon_union_16_3_a3f0114d_for___in6_u *)
                  ((long)&(this->local_endpoint).impl_.data_ + 8))->__u6_addr8;
      local_18 = (ulong)(this->local_endpoint).impl_.data_.v6.sin6_scope_id;
      local_30._0_4_ = ipv6;
      local_30._4_4_ = (in4_addr_type)0;
    }
    if ((anon_enum_32)local_30 == aVar2) {
      if ((anon_enum_32)local_30 == ipv6) {
        auVar5[0] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[0] == local_28.__u6_addr8[0]);
        auVar5[1] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[1] == local_28.__u6_addr8[1]);
        auVar5[2] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[2] == local_28.__u6_addr8[2]);
        auVar5[3] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[3] == local_28.__u6_addr8[3]);
        auVar5[4] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[4] == local_28.__u6_addr8[4]);
        auVar5[5] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[5] == local_28.__u6_addr8[5]);
        auVar5[6] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[6] == local_28.__u6_addr8[6]);
        auVar5[7] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[7] == local_28.__u6_addr8[7]);
        auVar5[8] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[8] == local_28.__u6_addr8[8]);
        auVar5[9] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[9] == local_28.__u6_addr8[9]);
        auVar5[10] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[10] == local_28.__u6_addr8[10]
                      );
        auVar5[0xb] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[0xb] ==
                       local_28.__u6_addr8[0xb]);
        auVar5[0xc] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[0xc] ==
                       local_28.__u6_addr8[0xc]);
        auVar5[0xd] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[0xd] ==
                       local_28.__u6_addr8[0xd]);
        auVar5[0xe] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[0xe] ==
                       local_28.__u6_addr8[0xe]);
        auVar5[0xf] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[0xf] ==
                       local_28.__u6_addr8[0xf]);
        bVar3 = local_18 == (addr->ipv6_address_).scope_id_ &&
                (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar5[0xf] >> 7) << 0xf) == 0xffff;
      }
      else {
        bVar3 = local_30._4_4_ == (in4_addr_type)(addr->ipv4_address_).addr_.s_addr;
      }
      if (bVar3) {
        return true;
      }
    }
    if (sVar1 == 2) {
      bVar3 = (this->local_endpoint).impl_.data_.v6.sin6_flowinfo == 0;
    }
    else {
      bVar3 = ((((((*(char *)((long)&(this->local_endpoint).impl_.data_ + 0x12) == '\0' &&
                   *(char *)((long)&(this->local_endpoint).impl_.data_ + 0x11) == '\0') &&
                  *(char *)((long)&(this->local_endpoint).impl_.data_ + 0x13) == '\0') &&
                 *(char *)((long)&(this->local_endpoint).impl_.data_ + 0x14) == '\0') &&
                *(char *)((long)&(this->local_endpoint).impl_.data_ + 0x15) == '\0') &&
               *(char *)((long)&(this->local_endpoint).impl_.data_ + 0x16) == '\0') &&
              ((((((((this->local_endpoint).impl_.data_.base.sa_data[9] == '\0' &&
                    (this->local_endpoint).impl_.data_.base.sa_data[8] == '\0') &&
                   (this->local_endpoint).impl_.data_.base.sa_data[10] == '\0') &&
                  (this->local_endpoint).impl_.data_.base.sa_data[0xb] == '\0') &&
                 (this->local_endpoint).impl_.data_.base.sa_data[0xc] == '\0') &&
                (this->local_endpoint).impl_.data_.base.sa_data[0xd] == '\0') &&
               *(char *)((long)&(this->local_endpoint).impl_.data_ + 0x10) == '\0') &&
              ((this->local_endpoint).impl_.data_.base.sa_data[7] == '\0' &&
              (this->local_endpoint).impl_.data_.base.sa_data[6] == '\0'))) &&
              *(char *)((long)&(this->local_endpoint).impl_.data_ + 0x17) == '\0';
    }
    if (!bVar3) {
      if (sVar1 == 2) {
        local_30 = (undefined **)
                   ((ulong)(this->local_endpoint).impl_.data_.v6.sin6_flowinfo << 0x20);
        local_28 = (anon_union_16_3_a3f0114d_for___in6_u)0x0;
        local_18 = 0;
      }
      else {
        local_28 = (this->local_endpoint).impl_.data_.v6.sin6_addr.__in6_u;
        local_18 = (ulong)(this->local_endpoint).impl_.data_.v6.sin6_scope_id;
        local_30 = (undefined **)0x1;
      }
      bVar3 = match_addr_mask(addr,(address *)&local_30,&this->netmask);
      if (!bVar3) {
        bVar4 = ((this->flags).m_val & 2) == 0;
      }
    }
  }
  else {
LAB_002c1995:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool listen_socket_t::can_route(address const& addr) const
	{
		// if this is a proxy, we assume it can reach everything
		if (flags & proxy) return true;

		if (is_v4(local_endpoint) != addr.is_v4()) return false;

		if (local_endpoint.address().is_v6()
			&& local_endpoint.address().to_v6().scope_id() != addr.to_v6().scope_id())
			return false;

		if (local_endpoint.address() == addr) return true;
		if (local_endpoint.address().is_unspecified()) return true;
		if (match_addr_mask(addr, local_endpoint.address(), netmask)) return true;
		return !(flags & local_network);
	}